

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.cpp
# Opt level: O2

float ncnn::float16_to_float32(unsigned_short value)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  float fVar5;
  
  uVar1 = (uint)(value >> 0xf);
  uVar2 = value >> 10 & 0x1f;
  if ((short)uVar2 == 0x1f) {
    fVar5 = (float)((uint)value << 0xd | uVar1 << 0x1f | 0x7f800000);
  }
  else {
    uVar4 = value & 0x3ff;
    if ((value & 0x7c00) == 0) {
      if ((short)uVar4 == 0) {
        fVar5 = (float)(uVar1 << 0x1f);
      }
      else {
        iVar3 = 0;
        while (uVar2 = uVar4 >> 9, uVar4 = uVar4 * 2, (uVar2 & 1) == 0) {
          iVar3 = iVar3 + 1;
        }
        fVar5 = (float)((uVar4 & 0x3fe) << 0xd | iVar3 * -0x800000 + 0x38000000U | uVar1 << 0x1f);
      }
    }
    else {
      fVar5 = (float)(uVar4 * 0x2000 + (uVar2 << 0x17 | uVar1 << 0x1f) + 0x38000000);
    }
  }
  return fVar5;
}

Assistant:

float float16_to_float32(unsigned short value)
{
    // 1 : 5 : 10
    unsigned short sign = (value & 0x8000) >> 15;
    unsigned short exponent = (value & 0x7c00) >> 10;
    unsigned short significand = value & 0x03FF;

    //     NCNN_LOGE("%d %d %d", sign, exponent, significand);

    // 1 : 8 : 23
    union
    {
        unsigned int u;
        float f;
    } tmp;
    if (exponent == 0)
    {
        if (significand == 0)
        {
            // zero
            tmp.u = (sign << 31);
        }
        else
        {
            // denormal
            exponent = 0;
            // find non-zero bit
            while ((significand & 0x200) == 0)
            {
                significand <<= 1;
                exponent++;
            }
            significand <<= 1;
            significand &= 0x3FF;
            tmp.u = (sign << 31) | ((-exponent + (-15 + 127)) << 23) | (significand << 13);
        }
    }
    else if (exponent == 0x1F)
    {
        // infinity or NaN
        tmp.u = (sign << 31) | (0xFF << 23) | (significand << 13);
    }
    else
    {
        // normalized
        tmp.u = (sign << 31) | ((exponent + (-15 + 127)) << 23) | (significand << 13);
    }

    return tmp.f;
}